

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *__cp;
  RTPTime RStack_10990;
  RTPTime RStack_10988;
  RTPPacket *pRStack_10980;
  RTPPacket *pack;
  RTPIPv4Address addr;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  RTPLibraryVersion RStack_10848;
  string sStack_10838;
  uint uStack_10818;
  uint uStack_10814;
  int num;
  int i;
  int status;
  uint32_t destip;
  uint16_t destport;
  allocator<char> aStack_107f1;
  string asStack_107f0 [8];
  string ipstr;
  undefined1 auStack_107c8 [6];
  uint16_t portbase;
  RTPSession sess;
  
  jrtplib::RTPSession::RTPSession
            ((RTPSession *)auStack_107c8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  ipstr.field_2._14_2_ = 8000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_107f0,"0.0.0.0",&aStack_107f1);
  std::allocator<char>::~allocator(&aStack_107f1);
  status._2_2_ = 10000;
  uStack_10818 = 100;
  poVar2 = std::operator<<((ostream *)&std::cout,"Using version ");
  RStack_10848 = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_(&sStack_10838,&RStack_10848);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_10838);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&sStack_10838);
  __cp = (char *)std::__cxx11::string::c_str();
  i = inet_addr(__cp);
  i = ntohl(i);
  jrtplib::RTPUDPv4TransmissionParams::RTPUDPv4TransmissionParams
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)&addr.port);
  jrtplib::RTPSessionParams::SetOwnTimestampUnit((RTPSessionParams *)&addr.port,0.1);
  jrtplib::RTPSessionParams::SetAcceptOwnPackets((RTPSessionParams *)&addr.port,true);
  jrtplib::RTPUDPv4TransmissionParams::SetPortbase
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety,ipstr.field_2._14_2_);
  num = jrtplib::RTPSession::Create
                  ((RTPSession *)auStack_107c8,(RTPSessionParams *)&addr.port,
                   (RTPTransmissionParams *)&sessparams.m_needThreadSafety,IPv4UDPProto);
  checkerror(num);
  jrtplib::RTPIPv4Address::RTPIPv4Address((RTPIPv4Address *)&pack,i,status._2_2_,false);
  num = jrtplib::RTPSession::AddDestination((RTPSession *)auStack_107c8,(RTPAddress *)&pack);
  checkerror(num);
  for (uStack_10814 = 1; (int)uStack_10814 <= (int)uStack_10818; uStack_10814 = uStack_10814 + 1) {
    printf("\nSending packet %d/%d\n",(ulong)uStack_10814,(ulong)uStack_10818);
    num = jrtplib::RTPSession::SendPacket((RTPSession *)auStack_107c8,"1234567890",10,'\0',false,10)
    ;
    checkerror(num);
    jrtplib::RTPSession::BeginDataAccess((RTPSession *)auStack_107c8);
    bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData((RTPSession *)auStack_107c8);
    if (bVar1) {
      do {
        while( true ) {
          pRStack_10980 = jrtplib::RTPSession::GetNextPacket((RTPSession *)auStack_107c8);
          if (pRStack_10980 == (RTPPacket *)0x0) break;
          printf("Got packet !\n");
          jrtplib::RTPSession::DeletePacket((RTPSession *)auStack_107c8,pRStack_10980);
        }
        bVar1 = jrtplib::RTPSession::GotoNextSourceWithData((RTPSession *)auStack_107c8);
      } while (bVar1);
    }
    jrtplib::RTPSession::EndDataAccess((RTPSession *)auStack_107c8);
    num = jrtplib::RTPSession::Poll((RTPSession *)auStack_107c8);
    checkerror(num);
    jrtplib::RTPTime::RTPTime(&RStack_10988,1,0);
    jrtplib::RTPTime::Wait(&RStack_10988);
  }
  jrtplib::RTPTime::RTPTime(&RStack_10990,10,0);
  jrtplib::RTPSession::BYEDestroy((RTPSession *)auStack_107c8,&RStack_10990,(void *)0x0,0);
  jrtplib::RTPIPv4Address::~RTPIPv4Address((RTPIPv4Address *)&pack);
  jrtplib::RTPSessionParams::~RTPSessionParams((RTPSessionParams *)&addr.port);
  jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams
            ((RTPUDPv4TransmissionParams *)&sessparams.m_needThreadSafety);
  std::__cxx11::string::~string(asStack_107f0);
  jrtplib::RTPSession::~RTPSession((RTPSession *)auStack_107c8);
  return 0;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	RTPSession sess;
	uint16_t portbase = 8000;
	std::string ipstr = "0.0.0.0";
	uint16_t destport = 10000;
	uint32_t destip;
	int status,i;
	int num = 100;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	destip = inet_addr(ipstr.c_str());
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}